

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TcpBroker.cpp
# Opt level: O1

void __thiscall helics::tcp::TcpBrokerSS::TcpBrokerSS(TcpBrokerSS *this,bool rootBroker)

{
  CommsBroker<helics::tcp::TcpCommsSS,_helics::CoreBroker>::CommsBroker
            ((CommsBroker<helics::tcp::TcpCommsSS,_helics::CoreBroker> *)this,rootBroker);
  (this->super_NetworkBroker<helics::tcp::TcpCommsSS,_(gmlc::networking::InterfaceTypes)0,_11>).
  super_CommsBroker<helics::tcp::TcpCommsSS,_helics::CoreBroker>.super_CoreBroker.super_Broker.
  _vptr_Broker = (_func_int **)&PTR__NetworkBroker_0055ce60;
  (this->super_NetworkBroker<helics::tcp::TcpCommsSS,_(gmlc::networking::InterfaceTypes)0,_11>).
  super_CommsBroker<helics::tcp::TcpCommsSS,_helics::CoreBroker>.super_CoreBroker.super_BrokerBase.
  _vptr_BrokerBase = (_func_int **)&PTR__NetworkBroker_0055cfc0;
  (this->super_NetworkBroker<helics::tcp::TcpCommsSS,_(gmlc::networking::InterfaceTypes)0,_11>).
  dataMutex.super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)
   ((long)&(this->
           super_NetworkBroker<helics::tcp::TcpCommsSS,_(gmlc::networking::InterfaceTypes)0,_11>).
           dataMutex.super___mutex_base._M_mutex + 8) = 0;
  *(undefined8 *)
   ((long)&(this->
           super_NetworkBroker<helics::tcp::TcpCommsSS,_(gmlc::networking::InterfaceTypes)0,_11>).
           dataMutex.super___mutex_base._M_mutex + 0x10) = 0;
  (this->super_NetworkBroker<helics::tcp::TcpCommsSS,_(gmlc::networking::InterfaceTypes)0,_11>).
  dataMutex.super___mutex_base._M_mutex.__data.__list.__prev = (__pthread_internal_list *)0x0;
  (this->super_NetworkBroker<helics::tcp::TcpCommsSS,_(gmlc::networking::InterfaceTypes)0,_11>).
  dataMutex.super___mutex_base._M_mutex.__data.__list.__next = (__pthread_internal_list *)0x0;
  NetworkBrokerData::NetworkBrokerData
            (&(this->
              super_NetworkBroker<helics::tcp::TcpCommsSS,_(gmlc::networking::InterfaceTypes)0,_11>)
              .netInfo,TCP);
  (this->super_NetworkBroker<helics::tcp::TcpCommsSS,_(gmlc::networking::InterfaceTypes)0,_11>).
  netInfo.server_mode = SERVER_DEFAULT_ACTIVE;
  (this->super_NetworkBroker<helics::tcp::TcpCommsSS,_(gmlc::networking::InterfaceTypes)0,_11>).
  super_CommsBroker<helics::tcp::TcpCommsSS,_helics::CoreBroker>.super_CoreBroker.super_Broker.
  _vptr_Broker = (_func_int **)&PTR__TcpBrokerSS_0055fc20;
  (this->super_NetworkBroker<helics::tcp::TcpCommsSS,_(gmlc::networking::InterfaceTypes)0,_11>).
  super_CommsBroker<helics::tcp::TcpCommsSS,_helics::CoreBroker>.super_CoreBroker.super_BrokerBase.
  _vptr_BrokerBase = (_func_int **)&PTR__TcpBrokerSS_0055fd80;
  this->no_outgoing_connections = false;
  (this->connections).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->connections).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->connections).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  return;
}

Assistant:

TcpBrokerSS::TcpBrokerSS(bool rootBroker) noexcept: NetworkBroker(rootBroker) {}